

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O0

ElementsConfidentialAddress * __thiscall
cfd::core::ElementsConfidentialAddress::operator=
          (ElementsConfidentialAddress *this,ElementsConfidentialAddress *object)

{
  ElementsConfidentialAddress *object_local;
  ElementsConfidentialAddress *this_local;
  
  if (this != object) {
    core::Address::operator=(&this->unblinded_address_,&object->unblinded_address_);
    Pubkey::operator=(&this->confidential_key_,&object->confidential_key_);
    ::std::__cxx11::string::operator=((string *)&this->address_,(string *)&object->address_);
  }
  return this;
}

Assistant:

ElementsConfidentialAddress& ElementsConfidentialAddress::operator=(
    const ElementsConfidentialAddress& object) & {
  if (this != &object) {
    unblinded_address_ = object.unblinded_address_;
    confidential_key_ = object.confidential_key_;
    address_ = object.address_;
  }
  return *this;
}